

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledGetSuperProperty<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint localRegisterID;
  InlineCacheIndex inlineCacheIndex;
  FunctionBody *functionBody;
  PropertyId propertyId;
  Var pvVar1;
  InlineCache *inlineCache;
  Var thisInstance;
  
  localRegisterID = playout->Value;
  pvVar1 = GetReg<unsigned_int>(this,playout->Instance);
  propertyId = GetPropertyIdFromCacheId(this,playout->PropertyIdIndex);
  inlineCache = GetInlineCache(this,playout->PropertyIdIndex);
  inlineCacheIndex = playout->PropertyIdIndex;
  functionBody = *(FunctionBody **)(this + 0x88);
  thisInstance = GetReg<unsigned_int>(this,playout->Value2);
  pvVar1 = ProfilingHelpers::ProfiledLdFld<false,false,false>
                     (pvVar1,propertyId,inlineCache,inlineCacheIndex,functionBody,thisInstance);
  SetReg<unsigned_int>(this,localRegisterID,pvVar1);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfiledGetSuperProperty(unaligned T* playout)
    {
        SetReg(
            playout->Value,
            ProfilingHelpers::ProfiledLdFld<false, false, false>(
                GetReg(playout->Instance),
                GetPropertyIdFromCacheId(playout->PropertyIdIndex),
                GetInlineCache(playout->PropertyIdIndex),
                playout->PropertyIdIndex,
                GetFunctionBody(),
                GetReg(playout->Value2)));

    }